

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [5])

{
  bool bVar1;
  stringstream *this_00;
  size_t sVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
  local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
  ;
  sVar2 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this_00 + 0x10),*value,sVar2);
  AppendMessage(this,(Message *)&local_30);
  if (((local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = internal::IsTrue(true), bVar1)) &&
     (local_30.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_30.ptr_ + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }